

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heaplist.h
# Opt level: O1

void __thiscall HeapList::AddHeap(HeapList *this,int key)

{
  pointer *pppIVar1;
  iterator __position;
  IHeap *pIVar2;
  _func_int **pp_Var3;
  int __tmp;
  IHeap *local_20;
  
  switch(this->TYPE) {
  case Binomial:
    pIVar2 = (IHeap *)operator_new(0x10);
    pIVar2->_vptr_IHeap = (_func_int **)&PTR_Insert_0013e1a8;
    pp_Var3 = (_func_int **)operator_new(0x20);
    *(int *)pp_Var3 = key;
    pp_Var3[1] = (_func_int *)0x0;
    pp_Var3[2] = (_func_int *)0x0;
    *(undefined4 *)(pp_Var3 + 3) = 0;
    break;
  case Leftist:
    pIVar2 = (IHeap *)operator_new(0x10);
    pIVar2->_vptr_IHeap = (_func_int **)&PTR_Insert_0013e138;
    pp_Var3 = (_func_int **)operator_new(0x18);
    *(int *)pp_Var3 = key;
    *(undefined8 *)((long)pp_Var3 + 4) = 0;
    *(undefined8 *)((long)pp_Var3 + 0xc) = 0;
    *(undefined4 *)((long)pp_Var3 + 0x14) = 0;
    break;
  case Skew:
    pIVar2 = (IHeap *)operator_new(0x10);
    pIVar2->_vptr_IHeap = (_func_int **)&PTR_Insert_0013e208;
    pp_Var3 = (_func_int **)operator_new(0x18);
    *(int *)pp_Var3 = key;
    pp_Var3[1] = (_func_int *)0x0;
    pp_Var3[2] = (_func_int *)0x0;
    break;
  case Fool:
    pIVar2 = (IHeap *)operator_new(0x20);
    pIVar2->_vptr_IHeap = (_func_int **)&PTR_Insert_0013e268;
    pIVar2[1]._vptr_IHeap = (_func_int **)0x0;
    pIVar2[2]._vptr_IHeap = (_func_int **)0x0;
    pIVar2[3]._vptr_IHeap = (_func_int **)0x0;
    pp_Var3 = (_func_int **)operator_new(4);
    pIVar2[1]._vptr_IHeap = pp_Var3;
    pIVar2[2]._vptr_IHeap = pp_Var3;
    pIVar2[3]._vptr_IHeap = (_func_int **)((long)pp_Var3 + 4);
    *(int *)pp_Var3 = key;
    pIVar2[2]._vptr_IHeap = (_func_int **)((long)pp_Var3 + 4);
    goto LAB_0010acf9;
  default:
    goto switchD_0010ac14_default;
  }
  pIVar2[1]._vptr_IHeap = pp_Var3;
LAB_0010acf9:
  __position._M_current =
       (this->list_).super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->list_).super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_20 = pIVar2;
    std::vector<IHeap*,std::allocator<IHeap*>>::_M_realloc_insert<IHeap*>
              ((vector<IHeap*,std::allocator<IHeap*>> *)this,__position,&local_20);
  }
  else {
    *__position._M_current = pIVar2;
    pppIVar1 = &(this->list_).super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
switchD_0010ac14_default:
  return;
}

Assistant:

void AddHeap(int key) {

        switch(TYPE) {
            case Leftist: {
                list_.push_back(new CLeftistHeap(key));
            } break;
            case Binomial: {
                list_.push_back(new CBinomialHeap(key));
            } break;

            case Skew: {
                list_.push_back(new CSkewHeap(key));
            } break;
            case Fool: {
                list_.push_back(new CFoolHeap(key));
            } break;
        }
    }